

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_550beb::Db::parseAbiTags(Db *this,Node *N)

{
  Cache CVar1;
  char *pcVar2;
  Cache CVar3;
  Cache CVar4;
  Node *pNVar5;
  StringView SVar6;
  
  while( true ) {
    pcVar2 = this->First;
    if (pcVar2 == this->Last) {
      return N;
    }
    if (*pcVar2 != 'B') break;
    this->First = pcVar2 + 1;
    SVar6 = parseBareSourceName(this);
    if (SVar6.First == SVar6.Last) {
      return (Node *)0x0;
    }
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    CVar3 = N->RHSComponentCache;
    CVar4 = N->ArrayCache;
    CVar1 = N->FunctionCache;
    pNVar5->K = KAbiTagAttr;
    pNVar5->RHSComponentCache = CVar3;
    pNVar5->ArrayCache = CVar4;
    pNVar5->FunctionCache = CVar1;
    pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002173a0;
    pNVar5[1]._vptr_Node = (_func_int **)N;
    *(StringView *)&pNVar5[1].K = SVar6;
    N = pNVar5;
  }
  return N;
}

Assistant:

Node *Db::parseAbiTags(Node *N) {
  while (consumeIf('B')) {
    StringView SN = parseBareSourceName();
    if (SN.empty())
      return nullptr;
    N = make<AbiTagAttr>(N, SN);
  }
  return N;
}